

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTest.hpp
# Opt level: O3

void Qentem::Test::TestStringCompare(QTest *test)

{
  SizeT SVar1;
  ulong uVar2;
  bool bVar3;
  QString str1;
  QString str2;
  char *str3;
  String<char> local_58;
  String<char> local_48;
  char *local_38;
  
  String<char>::String(&local_58,"a");
  String<char>::String(&local_48,"a");
  local_38 = "a";
  QTest::IsEqual<Qentem::String<char>,Qentem::String<char>>(test,&local_58,&local_48,0x8e);
  QTest::IsEqual<Qentem::String<char>,Qentem::String<char>>(test,&local_48,&local_58,0x8f);
  QTest::IsEqual<Qentem::String<char>,char_const*>(test,&local_58,&local_38,0x90);
  QTest::IsEqual<Qentem::String<char>,char_const*>(test,&local_48,&local_38,0x91);
  String<char>::operator=(&local_58,"abc");
  String<char>::operator=(&local_48,"abc");
  local_38 = "abc";
  QTest::IsEqual<Qentem::String<char>,Qentem::String<char>>(test,&local_58,&local_48,0x96);
  QTest::IsEqual<Qentem::String<char>,Qentem::String<char>>(test,&local_48,&local_58,0x97);
  QTest::IsEqual<Qentem::String<char>,char_const*>(test,&local_58,&local_38,0x98);
  QTest::IsEqual<Qentem::String<char>,char_const*>(test,&local_48,&local_38,0x99);
  String<char>::operator=(&local_58,"a");
  String<char>::operator=(&local_48,"b");
  local_38 = "c";
  QTest::IsNotEqual<Qentem::String<char>,Qentem::String<char>>(test,&local_58,&local_48,0x9e);
  QTest::IsNotEqual<Qentem::String<char>,Qentem::String<char>>(test,&local_48,&local_58,0x9f);
  QTest::IsNotEqual<Qentem::String<char>,char_const*>(test,&local_58,&local_38,0xa0);
  QTest::IsNotEqual<Qentem::String<char>,char_const*>(test,&local_48,&local_38,0xa1);
  String<char>::operator=(&local_58,"abc");
  String<char>::operator=(&local_48,"efg");
  local_38 = "hij";
  QTest::IsNotEqual<Qentem::String<char>,Qentem::String<char>>(test,&local_58,&local_48,0xa6);
  QTest::IsNotEqual<Qentem::String<char>,Qentem::String<char>>(test,&local_48,&local_58,0xa7);
  QTest::IsNotEqual<Qentem::String<char>,char_const*>(test,&local_58,&local_38,0xa8);
  QTest::IsNotEqual<Qentem::String<char>,char_const*>(test,&local_48,&local_38,0xa9);
  String<char>::operator=(&local_58,"a");
  String<char>::operator=(&local_48,"ef");
  local_38 = "abc";
  QTest::IsNotEqual<Qentem::String<char>,Qentem::String<char>>(test,&local_58,&local_48,0xae);
  QTest::IsNotEqual<Qentem::String<char>,Qentem::String<char>>(test,&local_48,&local_58,0xaf);
  QTest::IsNotEqual<Qentem::String<char>,char_const*>(test,&local_58,&local_38,0xb0);
  QTest::IsNotEqual<Qentem::String<char>,char_const*>(test,&local_48,&local_38,0xb1);
  String<char>::operator=(&local_58,"");
  if (local_58.length_ == 1) {
    bVar3 = *local_58.storage_ == ' ';
  }
  else {
    bVar3 = false;
  }
  QTest::IsFalse(test,bVar3,0xb4);
  String<char>::operator=(&local_58,"");
  String<char>::operator=(&local_48,"");
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_58.storage_[uVar2] != local_48.storage_[uVar2]) {
        bVar3 = local_48.storage_[uVar2] <= local_58.storage_[uVar2];
        goto LAB_00102154;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = local_58.length_ == local_48.length_;
LAB_00102154:
  QTest::IsTrue(test,bVar3,0xb8);
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_58.storage_[uVar2] != local_48.storage_[uVar2]) {
        bVar3 = local_58.storage_[uVar2] <= local_48.storage_[uVar2];
        goto LAB_001021a1;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = local_58.length_ == local_48.length_;
LAB_001021a1:
  QTest::IsTrue(test,bVar3,0xb9);
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_58.storage_[uVar2] < local_48.storage_[uVar2]) break;
      if (local_48.storage_[uVar2] < local_58.storage_[uVar2]) {
        bVar3 = true;
        goto LAB_001021e9;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = false;
LAB_001021e9:
  QTest::IsFalse(test,bVar3,0xba);
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_48.storage_[uVar2] < local_58.storage_[uVar2]) break;
      if (local_58.storage_[uVar2] < local_48.storage_[uVar2]) {
        bVar3 = true;
        goto LAB_00102231;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = false;
LAB_00102231:
  QTest::IsFalse(test,bVar3,0xbb);
  String<char>::operator=(&local_58,"a");
  String<char>::operator=(&local_48,"a");
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_58.storage_[uVar2] != local_48.storage_[uVar2]) {
        bVar3 = local_48.storage_[uVar2] <= local_58.storage_[uVar2];
        goto LAB_001022a4;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = local_58.length_ == local_48.length_;
LAB_001022a4:
  QTest::IsTrue(test,bVar3,0xbf);
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_58.storage_[uVar2] != local_48.storage_[uVar2]) {
        bVar3 = local_58.storage_[uVar2] <= local_48.storage_[uVar2];
        goto LAB_001022f1;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = local_58.length_ == local_48.length_;
LAB_001022f1:
  QTest::IsTrue(test,bVar3,0xc0);
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_58.storage_[uVar2] < local_48.storage_[uVar2]) break;
      if (local_48.storage_[uVar2] < local_58.storage_[uVar2]) {
        bVar3 = true;
        goto LAB_00102339;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = false;
LAB_00102339:
  QTest::IsFalse(test,bVar3,0xc1);
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_48.storage_[uVar2] < local_58.storage_[uVar2]) break;
      if (local_58.storage_[uVar2] < local_48.storage_[uVar2]) {
        bVar3 = true;
        goto LAB_00102381;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = false;
LAB_00102381:
  QTest::IsFalse(test,bVar3,0xc2);
  String<char>::operator=(&local_58,"a");
  String<char>::operator=(&local_48,"A");
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_58.storage_[uVar2] != local_48.storage_[uVar2]) {
        bVar3 = local_48.storage_[uVar2] <= local_58.storage_[uVar2];
        goto LAB_001023f4;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = local_58.length_ == local_48.length_;
LAB_001023f4:
  QTest::IsTrue(test,bVar3,0xc6);
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_58.storage_[uVar2] < local_48.storage_[uVar2]) break;
      if (local_48.storage_[uVar2] < local_58.storage_[uVar2]) {
        bVar3 = true;
        goto LAB_0010243c;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = false;
LAB_0010243c:
  QTest::IsTrue(test,bVar3,199);
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_58.storage_[uVar2] != local_48.storage_[uVar2]) {
        bVar3 = local_58.storage_[uVar2] <= local_48.storage_[uVar2];
        goto LAB_00102489;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = local_58.length_ == local_48.length_;
LAB_00102489:
  QTest::IsFalse(test,bVar3,200);
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_48.storage_[uVar2] < local_58.storage_[uVar2]) break;
      if (local_58.storage_[uVar2] < local_48.storage_[uVar2]) {
        bVar3 = true;
        goto LAB_001024d1;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = false;
LAB_001024d1:
  QTest::IsFalse(test,bVar3,0xc9);
  SVar1 = local_58.length_;
  if (local_48.length_ < local_58.length_) {
    SVar1 = local_48.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_48.storage_[uVar2] != local_58.storage_[uVar2]) {
        bVar3 = local_58.storage_[uVar2] <= local_48.storage_[uVar2];
        goto LAB_0010251e;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = local_48.length_ == local_58.length_;
LAB_0010251e:
  QTest::IsFalse(test,bVar3,0xcb);
  SVar1 = local_58.length_;
  if (local_48.length_ < local_58.length_) {
    SVar1 = local_48.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_48.storage_[uVar2] < local_58.storage_[uVar2]) break;
      if (local_58.storage_[uVar2] < local_48.storage_[uVar2]) {
        bVar3 = true;
        goto LAB_00102566;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = false;
LAB_00102566:
  QTest::IsFalse(test,bVar3,0xcc);
  SVar1 = local_58.length_;
  if (local_48.length_ < local_58.length_) {
    SVar1 = local_48.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_48.storage_[uVar2] != local_58.storage_[uVar2]) {
        bVar3 = local_48.storage_[uVar2] <= local_58.storage_[uVar2];
        goto LAB_001025b3;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = local_48.length_ == local_58.length_;
LAB_001025b3:
  QTest::IsTrue(test,bVar3,0xcd);
  SVar1 = local_58.length_;
  if (local_48.length_ < local_58.length_) {
    SVar1 = local_48.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_58.storage_[uVar2] < local_48.storage_[uVar2]) break;
      if (local_48.storage_[uVar2] < local_58.storage_[uVar2]) {
        bVar3 = true;
        goto LAB_001025fb;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = false;
LAB_001025fb:
  QTest::IsTrue(test,bVar3,0xce);
  String<char>::operator=(&local_58,"a");
  String<char>::operator=(&local_48,"B");
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_58.storage_[uVar2] != local_48.storage_[uVar2]) {
        bVar3 = local_48.storage_[uVar2] <= local_58.storage_[uVar2];
        goto LAB_0010266e;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = local_58.length_ == local_48.length_;
LAB_0010266e:
  QTest::IsTrue(test,bVar3,0xd2);
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_58.storage_[uVar2] < local_48.storage_[uVar2]) break;
      if (local_48.storage_[uVar2] < local_58.storage_[uVar2]) {
        bVar3 = true;
        goto LAB_001026b6;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = false;
LAB_001026b6:
  QTest::IsTrue(test,bVar3,0xd3);
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_58.storage_[uVar2] != local_48.storage_[uVar2]) {
        bVar3 = local_58.storage_[uVar2] <= local_48.storage_[uVar2];
        goto LAB_00102703;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = local_58.length_ == local_48.length_;
LAB_00102703:
  QTest::IsFalse(test,bVar3,0xd4);
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_48.storage_[uVar2] < local_58.storage_[uVar2]) break;
      if (local_58.storage_[uVar2] < local_48.storage_[uVar2]) {
        bVar3 = true;
        goto LAB_0010274b;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = false;
LAB_0010274b:
  QTest::IsFalse(test,bVar3,0xd5);
  SVar1 = local_58.length_;
  if (local_48.length_ < local_58.length_) {
    SVar1 = local_48.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_48.storage_[uVar2] != local_58.storage_[uVar2]) {
        bVar3 = local_58.storage_[uVar2] <= local_48.storage_[uVar2];
        goto LAB_00102798;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = local_48.length_ == local_58.length_;
LAB_00102798:
  QTest::IsFalse(test,bVar3,0xd7);
  SVar1 = local_58.length_;
  if (local_48.length_ < local_58.length_) {
    SVar1 = local_48.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_48.storage_[uVar2] < local_58.storage_[uVar2]) break;
      if (local_58.storage_[uVar2] < local_48.storage_[uVar2]) {
        bVar3 = true;
        goto LAB_001027e0;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = false;
LAB_001027e0:
  QTest::IsFalse(test,bVar3,0xd8);
  SVar1 = local_58.length_;
  if (local_48.length_ < local_58.length_) {
    SVar1 = local_48.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_48.storage_[uVar2] != local_58.storage_[uVar2]) {
        bVar3 = local_48.storage_[uVar2] <= local_58.storage_[uVar2];
        goto LAB_0010282d;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = local_48.length_ == local_58.length_;
LAB_0010282d:
  QTest::IsTrue(test,bVar3,0xd9);
  SVar1 = local_58.length_;
  if (local_48.length_ < local_58.length_) {
    SVar1 = local_48.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_58.storage_[uVar2] < local_48.storage_[uVar2]) break;
      if (local_48.storage_[uVar2] < local_58.storage_[uVar2]) {
        bVar3 = true;
        goto LAB_00102875;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = false;
LAB_00102875:
  QTest::IsTrue(test,bVar3,0xda);
  String<char>::operator=(&local_58,"aa");
  String<char>::operator=(&local_48,"aA");
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_58.storage_[uVar2] != local_48.storage_[uVar2]) {
        bVar3 = local_48.storage_[uVar2] <= local_58.storage_[uVar2];
        goto LAB_001028e8;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = local_58.length_ == local_48.length_;
LAB_001028e8:
  QTest::IsTrue(test,bVar3,0xde);
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_58.storage_[uVar2] < local_48.storage_[uVar2]) break;
      if (local_48.storage_[uVar2] < local_58.storage_[uVar2]) {
        bVar3 = true;
        goto LAB_00102930;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = false;
LAB_00102930:
  QTest::IsTrue(test,bVar3,0xdf);
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_58.storage_[uVar2] != local_48.storage_[uVar2]) {
        bVar3 = local_58.storage_[uVar2] <= local_48.storage_[uVar2];
        goto LAB_0010297d;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = local_58.length_ == local_48.length_;
LAB_0010297d:
  QTest::IsFalse(test,bVar3,0xe0);
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_48.storage_[uVar2] < local_58.storage_[uVar2]) break;
      if (local_58.storage_[uVar2] < local_48.storage_[uVar2]) {
        bVar3 = true;
        goto LAB_001029c5;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = false;
LAB_001029c5:
  QTest::IsFalse(test,bVar3,0xe1);
  SVar1 = local_58.length_;
  if (local_48.length_ < local_58.length_) {
    SVar1 = local_48.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_48.storage_[uVar2] != local_58.storage_[uVar2]) {
        bVar3 = local_58.storage_[uVar2] <= local_48.storage_[uVar2];
        goto LAB_00102a12;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = local_48.length_ == local_58.length_;
LAB_00102a12:
  QTest::IsFalse(test,bVar3,0xe3);
  SVar1 = local_58.length_;
  if (local_48.length_ < local_58.length_) {
    SVar1 = local_48.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_48.storage_[uVar2] < local_58.storage_[uVar2]) break;
      if (local_58.storage_[uVar2] < local_48.storage_[uVar2]) {
        bVar3 = true;
        goto LAB_00102a5a;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = false;
LAB_00102a5a:
  QTest::IsFalse(test,bVar3,0xe4);
  SVar1 = local_58.length_;
  if (local_48.length_ < local_58.length_) {
    SVar1 = local_48.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_48.storage_[uVar2] != local_58.storage_[uVar2]) {
        bVar3 = local_48.storage_[uVar2] <= local_58.storage_[uVar2];
        goto LAB_00102aa7;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = local_48.length_ == local_58.length_;
LAB_00102aa7:
  QTest::IsTrue(test,bVar3,0xe5);
  SVar1 = local_58.length_;
  if (local_48.length_ < local_58.length_) {
    SVar1 = local_48.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_58.storage_[uVar2] < local_48.storage_[uVar2]) break;
      if (local_48.storage_[uVar2] < local_58.storage_[uVar2]) {
        bVar3 = true;
        goto LAB_00102aef;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = false;
LAB_00102aef:
  QTest::IsTrue(test,bVar3,0xe6);
  String<char>::operator=(&local_58,"2021");
  String<char>::operator=(&local_48,"2018");
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_58.storage_[uVar2] != local_48.storage_[uVar2]) {
        bVar3 = local_48.storage_[uVar2] <= local_58.storage_[uVar2];
        goto LAB_00102b62;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = local_58.length_ == local_48.length_;
LAB_00102b62:
  QTest::IsTrue(test,bVar3,0xea);
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_58.storage_[uVar2] < local_48.storage_[uVar2]) break;
      if (local_48.storage_[uVar2] < local_58.storage_[uVar2]) {
        bVar3 = true;
        goto LAB_00102baa;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = false;
LAB_00102baa:
  QTest::IsTrue(test,bVar3,0xeb);
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_58.storage_[uVar2] != local_48.storage_[uVar2]) {
        bVar3 = local_58.storage_[uVar2] <= local_48.storage_[uVar2];
        goto LAB_00102bf7;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = local_58.length_ == local_48.length_;
LAB_00102bf7:
  QTest::IsFalse(test,bVar3,0xec);
  SVar1 = local_48.length_;
  if (local_58.length_ < local_48.length_) {
    SVar1 = local_58.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_48.storage_[uVar2] < local_58.storage_[uVar2]) break;
      if (local_58.storage_[uVar2] < local_48.storage_[uVar2]) {
        bVar3 = true;
        goto LAB_00102c3f;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = false;
LAB_00102c3f:
  QTest::IsFalse(test,bVar3,0xed);
  SVar1 = local_58.length_;
  if (local_48.length_ < local_58.length_) {
    SVar1 = local_48.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_48.storage_[uVar2] != local_58.storage_[uVar2]) {
        bVar3 = local_58.storage_[uVar2] <= local_48.storage_[uVar2];
        goto LAB_00102c8c;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = local_48.length_ == local_58.length_;
LAB_00102c8c:
  QTest::IsFalse(test,bVar3,0xef);
  SVar1 = local_58.length_;
  if (local_48.length_ < local_58.length_) {
    SVar1 = local_48.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_48.storage_[uVar2] < local_58.storage_[uVar2]) break;
      if (local_58.storage_[uVar2] < local_48.storage_[uVar2]) {
        bVar3 = true;
        goto LAB_00102cd4;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = false;
LAB_00102cd4:
  QTest::IsFalse(test,bVar3,0xf0);
  SVar1 = local_58.length_;
  if (local_48.length_ < local_58.length_) {
    SVar1 = local_48.length_;
  }
  if (SVar1 != 0) {
    uVar2 = 0;
    do {
      if (local_48.storage_[uVar2] != local_58.storage_[uVar2]) {
        bVar3 = local_48.storage_[uVar2] <= local_58.storage_[uVar2];
        goto LAB_00102d21;
      }
      uVar2 = uVar2 + 1;
    } while (SVar1 != uVar2);
  }
  bVar3 = local_48.length_ == local_58.length_;
LAB_00102d21:
  QTest::IsTrue(test,bVar3,0xf1);
  if (local_48.length_ < local_58.length_) {
    local_58.length_ = local_48.length_;
  }
  if (local_58.length_ != 0) {
    uVar2 = 0;
    do {
      if (local_58.storage_[uVar2] < local_48.storage_[uVar2]) break;
      if (local_48.storage_[uVar2] < local_58.storage_[uVar2]) {
        bVar3 = true;
        goto LAB_00102d69;
      }
      uVar2 = uVar2 + 1;
    } while (local_58.length_ != uVar2);
  }
  bVar3 = false;
LAB_00102d69:
  QTest::IsTrue(test,bVar3,0xf2);
  if (local_48.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_48.storage_);
  }
  operator_delete(local_48.storage_);
  if (local_58.storage_ != (char *)0x0) {
    MemoryRecord::RemoveAllocation(local_58.storage_);
  }
  operator_delete(local_58.storage_);
  return;
}

Assistant:

static void TestStringCompare(QTest &test) {
    QString     str1("a");
    QString     str2("a");
    const char *str3 = "a";

    test.IsEqual(str1, str2, __LINE__);
    test.IsEqual(str2, str1, __LINE__);
    test.IsEqual(str1, str3, __LINE__);
    test.IsEqual(str2, str3, __LINE__);

    str1 = "abc";
    str2 = "abc";
    str3 = "abc";
    test.IsEqual(str1, str2, __LINE__);
    test.IsEqual(str2, str1, __LINE__);
    test.IsEqual(str1, str3, __LINE__);
    test.IsEqual(str2, str3, __LINE__);

    str1 = "a";
    str2 = "b";
    str3 = "c";
    test.IsNotEqual(str1, str2, __LINE__);
    test.IsNotEqual(str2, str1, __LINE__);
    test.IsNotEqual(str1, str3, __LINE__);
    test.IsNotEqual(str2, str3, __LINE__);

    str1 = "abc";
    str2 = "efg";
    str3 = "hij";
    test.IsNotEqual(str1, str2, __LINE__);
    test.IsNotEqual(str2, str1, __LINE__);
    test.IsNotEqual(str1, str3, __LINE__);
    test.IsNotEqual(str2, str3, __LINE__);

    str1 = "a";
    str2 = "ef";
    str3 = "abc";
    test.IsNotEqual(str1, str2, __LINE__);
    test.IsNotEqual(str2, str1, __LINE__);
    test.IsNotEqual(str1, str3, __LINE__);
    test.IsNotEqual(str2, str3, __LINE__);

    str1 = "";
    test.IsFalse(str1.IsEqual(" ", 1U), __LINE__);

    str1 = "";
    str2 = "";
    test.IsTrue((str1 >= str2), __LINE__);
    test.IsTrue((str1 <= str2), __LINE__);
    test.IsFalse((str1 > str2), __LINE__);
    test.IsFalse((str1 < str2), __LINE__);

    str1 = "a";
    str2 = "a";
    test.IsTrue((str1 >= str2), __LINE__);
    test.IsTrue((str1 <= str2), __LINE__);
    test.IsFalse((str1 > str2), __LINE__);
    test.IsFalse((str1 < str2), __LINE__);

    str1 = "a";
    str2 = "A";
    test.IsTrue((str1 >= str2), __LINE__);
    test.IsTrue((str1 > str2), __LINE__);
    test.IsFalse((str1 <= str2), __LINE__);
    test.IsFalse((str1 < str2), __LINE__);
    //
    test.IsFalse((str2 >= str1), __LINE__);
    test.IsFalse((str2 > str1), __LINE__);
    test.IsTrue((str2 <= str1), __LINE__);
    test.IsTrue((str2 < str1), __LINE__);

    str1 = "a";
    str2 = "B";
    test.IsTrue((str1 >= str2), __LINE__);
    test.IsTrue((str1 > str2), __LINE__);
    test.IsFalse((str1 <= str2), __LINE__);
    test.IsFalse((str1 < str2), __LINE__);
    //
    test.IsFalse((str2 >= str1), __LINE__);
    test.IsFalse((str2 > str1), __LINE__);
    test.IsTrue((str2 <= str1), __LINE__);
    test.IsTrue((str2 < str1), __LINE__);

    str1 = "aa";
    str2 = "aA";
    test.IsTrue((str1 >= str2), __LINE__);
    test.IsTrue((str1 > str2), __LINE__);
    test.IsFalse((str1 <= str2), __LINE__);
    test.IsFalse((str1 < str2), __LINE__);
    //
    test.IsFalse((str2 >= str1), __LINE__);
    test.IsFalse((str2 > str1), __LINE__);
    test.IsTrue((str2 <= str1), __LINE__);
    test.IsTrue((str2 < str1), __LINE__);

    str1 = "2021";
    str2 = "2018";
    test.IsTrue((str1 >= str2), __LINE__);
    test.IsTrue((str1 > str2), __LINE__);
    test.IsFalse((str1 <= str2), __LINE__);
    test.IsFalse((str1 < str2), __LINE__);
    //
    test.IsFalse((str2 >= str1), __LINE__);
    test.IsFalse((str2 > str1), __LINE__);
    test.IsTrue((str2 <= str1), __LINE__);
    test.IsTrue((str2 < str1), __LINE__);
}